

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_attribute_corner_table.cc
# Opt level: O3

bool __thiscall
draco::MeshAttributeCornerTable::RecomputeVerticesInternal<false>
          (MeshAttributeCornerTable *this,Mesh *mesh,PointAttribute *att)

{
  uint uVar1;
  pointer pIVar2;
  iterator iVar3;
  long lVar4;
  iterator iVar5;
  uint uVar6;
  uint uVar7;
  pointer pIVar8;
  CornerTable *pCVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  CornerIndex first_c;
  AttributeValueIndex first_vert_id;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_3c;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_38;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_34;
  
  pIVar2 = (this->vertex_to_attribute_entry_id_map_).
           super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->vertex_to_attribute_entry_id_map_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar2) {
    (this->vertex_to_attribute_entry_id_map_).
    super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar2;
  }
  pIVar8 = (this->vertex_to_left_most_corner_map_).
           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->vertex_to_left_most_corner_map_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar8) {
    (this->vertex_to_left_most_corner_map_).
    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar8;
  }
  pCVar9 = this->corner_table_;
  pIVar8 = (pCVar9->vertex_corners_).vector_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(pCVar9->vertex_corners_).vector_.
                          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar8) >> 2) != 0) {
    uVar13 = 0;
    uVar12 = 0;
    do {
      uVar7 = pIVar8[uVar13].value_;
      if (uVar7 != 0xffffffff) {
        iVar3._M_current =
             (this->vertex_to_attribute_entry_id_map_).
             super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_34.value_ = uVar12;
        if (iVar3._M_current ==
            (this->vertex_to_attribute_entry_id_map_).
            super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>
          ::
          _M_realloc_insert<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>const&>
                    ((vector<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>
                      *)&this->vertex_to_attribute_entry_id_map_,iVar3,&local_34);
        }
        else {
          (iVar3._M_current)->value_ = uVar12;
          (this->vertex_to_attribute_entry_id_map_).
          super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        local_3c.value_ = 0;
        if (((this->is_vertex_on_seam_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar13 >> 6] >>
             (uVar13 & 0x3f) & 1) == 0) {
LAB_00134022:
          uVar11 = (ulong)uVar7;
          local_38.value_ = uVar7;
        }
        else {
          uVar1 = uVar7 - 2;
          if (0x55555555 < (uVar7 + 1) * -0x55555555) {
            uVar1 = uVar7 + 1;
          }
          lVar4 = (long)(this->is_edge_on_seam_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          if (uVar1 == 0xffffffff) {
            pCVar9 = this->corner_table_;
            uVar10 = 0xffffffff;
          }
          else {
            pCVar9 = this->corner_table_;
            uVar10 = 0xffffffff;
            if (((*(ulong *)(lVar4 + (ulong)(uVar1 >> 6) * 8) >> ((ulong)uVar1 & 0x3f) & 1) == 0) &&
               (uVar1 = (pCVar9->opposite_corners_).vector_.
                        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar1].value_, uVar1 != 0xffffffff
               )) {
              uVar6 = uVar1 - 2;
              if (0x55555555 < (uVar1 + 1) * -0x55555555) {
                uVar6 = uVar1 + 1;
              }
              uVar10 = (ulong)uVar6;
            }
          }
          local_3c.value_ = (uint)uVar10;
          if (local_3c.value_ == 0xffffffff) goto LAB_00134022;
          do {
            uVar11 = uVar10;
            local_38.value_ = (uint)uVar11;
            uVar1 = local_38.value_ - 2;
            if (0x55555555 < (local_38.value_ + 1) * -0x55555555) {
              uVar1 = local_38.value_ + 1;
            }
            uVar10 = 0xffffffff;
            if (((uVar1 != 0xffffffff) &&
                ((*(ulong *)(lVar4 + (ulong)(uVar1 >> 6) * 8) >> ((ulong)uVar1 & 0x3f) & 1) == 0))
               && (uVar1 = (pCVar9->opposite_corners_).vector_.
                           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar1].value_,
                  uVar1 != 0xffffffff)) {
              uVar6 = uVar1 - 2;
              if (0x55555555 < (uVar1 + 1) * -0x55555555) {
                uVar6 = uVar1 + 1;
              }
              uVar10 = (ulong)uVar6;
            }
            if ((uint)uVar10 == uVar7) {
              return false;
            }
          } while ((uint)uVar10 != 0xffffffff);
          local_3c.value_ = 0xffffffff;
        }
        (this->corner_to_vertex_map_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar11].value_ = local_34.value_;
        iVar5._M_current =
             (this->vertex_to_left_most_corner_map_).
             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->vertex_to_left_most_corner_map_).
            super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
          ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                    ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                      *)&this->vertex_to_left_most_corner_map_,iVar5,&local_38);
        }
        else {
          (iVar5._M_current)->value_ = local_38.value_;
          (this->vertex_to_left_most_corner_map_).
          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        uVar12 = uVar12 + 1;
        pCVar9 = this->corner_table_;
        if (local_38.value_ != 0xffffffff) {
          if (local_38.value_ * -0x55555555 < 0x55555556) {
            uVar7 = local_38.value_ + 2;
            if (uVar7 == 0xffffffff) goto LAB_001341d0;
          }
          else {
            uVar7 = local_38.value_ - 1;
          }
          uVar7 = (pCVar9->opposite_corners_).vector_.
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar7].value_;
          if ((uVar7 != 0xffffffff) &&
             (local_3c.value_ = ((uVar7 * -0x55555555 < 0x55555556) - 1 | 2) + uVar7,
             local_3c.value_ != local_38.value_ && local_3c.value_ != 0xffffffff)) {
            while( true ) {
              uVar7 = local_3c.value_ - 2;
              if (0x55555555 < (local_3c.value_ + 1) * -0x55555555) {
                uVar7 = local_3c.value_ + 1;
              }
              if ((*(ulong *)((long)(this->is_edge_on_seam_).
                                    super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                             + (ulong)(uVar7 >> 6) * 8) >> ((ulong)uVar7 & 0x3f) & 1) != 0) {
                iVar3._M_current =
                     (this->vertex_to_attribute_entry_id_map_).
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                local_34.value_ = uVar12;
                if (iVar3._M_current ==
                    (this->vertex_to_attribute_entry_id_map_).
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>
                  ::
                  _M_realloc_insert<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>const&>
                            ((vector<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>
                              *)&this->vertex_to_attribute_entry_id_map_,iVar3,&local_34);
                }
                else {
                  (iVar3._M_current)->value_ = uVar12;
                  (this->vertex_to_attribute_entry_id_map_).
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                }
                uVar12 = uVar12 + 1;
                iVar5._M_current =
                     (this->vertex_to_left_most_corner_map_).
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (iVar5._M_current ==
                    (this->vertex_to_left_most_corner_map_).
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                  ::
                  _M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                            ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                              *)&this->vertex_to_left_most_corner_map_,iVar5,&local_3c);
                }
                else {
                  (iVar5._M_current)->value_ = local_3c.value_;
                  (this->vertex_to_left_most_corner_map_).
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
                }
              }
              (this->corner_to_vertex_map_).
              super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[local_3c.value_].value_ = local_34.value_;
              pCVar9 = this->corner_table_;
              if (local_3c.value_ == 0xffffffff) break;
              if (local_3c.value_ * -0x55555555 < 0x55555556) {
                uVar7 = local_3c.value_ + 2;
                if (uVar7 == 0xffffffff) break;
              }
              else {
                uVar7 = local_3c.value_ - 1;
              }
              uVar7 = (pCVar9->opposite_corners_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar7].value_;
              if (((uVar7 == 0xffffffff) ||
                  (local_3c.value_ = ((uVar7 * -0x55555555 < 0x55555556) - 1 | 2) + uVar7,
                  local_3c.value_ == 0xffffffff)) || (local_3c.value_ == local_38.value_)) break;
            }
          }
        }
      }
LAB_001341d0:
      uVar13 = uVar13 + 1;
      pIVar8 = (pCVar9->vertex_corners_).vector_.
               super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar13 < ((ulong)((long)(pCVar9->vertex_corners_).vector_.
                                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar8) >> 2
                      & 0xffffffff));
  }
  return true;
}

Assistant:

bool MeshAttributeCornerTable::RecomputeVerticesInternal(
    const Mesh *mesh, const PointAttribute *att) {
  DRACO_DCHECK(GetValenceCache().IsCacheEmpty());
  vertex_to_attribute_entry_id_map_.clear();
  vertex_to_left_most_corner_map_.clear();
  int num_new_vertices = 0;
  for (VertexIndex v(0); v < corner_table_->num_vertices(); ++v) {
    const CornerIndex c = corner_table_->LeftMostCorner(v);
    if (c == kInvalidCornerIndex) {
      continue;  // Isolated vertex?
    }
    AttributeValueIndex first_vert_id(num_new_vertices++);
    if (init_vertex_to_attribute_entry_map) {
      const PointIndex point_id = mesh->CornerToPointId(c.value());
      vertex_to_attribute_entry_id_map_.push_back(att->mapped_index(point_id));
    } else {
      // Identity mapping
      vertex_to_attribute_entry_id_map_.push_back(first_vert_id);
    }
    CornerIndex first_c = c;
    CornerIndex act_c;
    // Check if the vertex is on a seam edge, if it is we need to find the first
    // attribute entry on the seam edge when traversing in the CCW direction.
    if (is_vertex_on_seam_[v.value()]) {
      // Try to swing left on the modified corner table. We need to get the
      // first corner that defines an attribute seam.
      act_c = SwingLeft(first_c);
      while (act_c != kInvalidCornerIndex) {
        first_c = act_c;
        act_c = SwingLeft(act_c);
        if (act_c == c) {
          // We reached the initial corner which shouldn't happen when we swing
          // left from |c|.
          return false;
        }
      }
    }
    corner_to_vertex_map_[first_c.value()] = VertexIndex(first_vert_id.value());
    vertex_to_left_most_corner_map_.push_back(first_c);
    act_c = corner_table_->SwingRight(first_c);
    while (act_c != kInvalidCornerIndex && act_c != first_c) {
      if (IsCornerOppositeToSeamEdge(corner_table_->Next(act_c))) {
        first_vert_id = AttributeValueIndex(num_new_vertices++);
        if (init_vertex_to_attribute_entry_map) {
          const PointIndex point_id = mesh->CornerToPointId(act_c.value());
          vertex_to_attribute_entry_id_map_.push_back(
              att->mapped_index(point_id));
        } else {
          // Identity mapping.
          vertex_to_attribute_entry_id_map_.push_back(first_vert_id);
        }
        vertex_to_left_most_corner_map_.push_back(act_c);
      }
      corner_to_vertex_map_[act_c.value()] = VertexIndex(first_vert_id.value());
      act_c = corner_table_->SwingRight(act_c);
    }
  }
  return true;
}